

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void aom_highbd_filter_block1d4_v4_avx2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar13 [16];
  undefined1 auVar12 [32];
  int in_stack_00000008;
  __m256i res_16bit;
  __m256i res_a_round;
  __m256i res_a;
  __m256i s56;
  __m256i s45;
  __m128i s6;
  __m128i s5;
  __m256i s34;
  __m128i s4;
  __m256i s23;
  __m128i s3;
  __m128i s2;
  uint16_t *data;
  __m256i ff [2];
  __m256i s [2];
  uint32_t i;
  __m256i zero;
  __m256i clip_pixel;
  __m256i round_const_bits;
  __m128i round_shift_bits;
  int bits;
  undefined4 local_6c8;
  undefined8 local_6c0;
  undefined8 uStackY_6a8;
  undefined1 in_stack_fffffffffffff960 [32];
  undefined1 in_stack_fffffffffffff980 [32];
  undefined8 local_5d0;
  undefined4 local_4c4;
  undefined8 local_400;
  undefined8 uStack_3d8;
  undefined8 local_220;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_190;
  undefined8 uStack_188;
  
  local_400 = SUB168(ZEXT416(7),0);
  auVar4 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
  auVar4 = vpinsrd_avx(auVar4,0x40,2);
  auVar4 = vpinsrd_avx(auVar4,0x40,3);
  auVar5 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
  auVar5 = vpinsrd_avx(auVar5,0x40,2);
  auVar5 = vpinsrd_avx(auVar5,0x40,3);
  auVar13 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  uStack_1d0 = auVar13._0_8_;
  uStack_1c8 = auVar13._8_8_;
  if (in_stack_00000008 == 10) {
    local_6c8 = 0x3ff;
  }
  else {
    local_6c8 = 0xff;
    if (in_stack_00000008 == 0xc) {
      local_6c8 = 0xfff;
    }
  }
  auVar13 = vpinsrd_avx(ZEXT416(local_6c8),local_6c8,1);
  auVar13 = vpinsrd_avx(auVar13,local_6c8,2);
  auVar13 = vpinsrd_avx(auVar13,local_6c8,3);
  auVar6 = vpinsrd_avx(ZEXT416(local_6c8),local_6c8,1);
  auVar6 = vpinsrd_avx(auVar6,local_6c8,2);
  auVar6 = vpinsrd_avx(auVar6,local_6c8,3);
  uStack_190 = auVar6._0_8_;
  uStack_188 = auVar6._8_8_;
  uStack_3d8 = SUB328(ZEXT832(0),4);
  pack_filters_4tap(in_stack_fffffffffffff960._8_8_,in_stack_fffffffffffff960._0_8_);
  uVar2 = *(ulong *)(in_RDI + in_RSI * 6);
  local_5d0 = *(ulong *)(in_RDI + in_RSI * 8);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(in_RDI + in_RSI * 4);
  auVar12._16_8_ = uVar2;
  auVar12._24_8_ = 0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar2;
  auVar7._16_8_ = local_5d0;
  auVar7._24_8_ = 0;
  vpunpcklwd_avx2(auVar12,auVar7);
  for (local_4c4 = 0; local_4c4 < in_R8D; local_4c4 = local_4c4 + 2) {
    lVar1 = in_RDI + (ulong)local_4c4 * in_RSI * 2;
    uVar2 = *(ulong *)(lVar1 + in_RSI * 10);
    uVar3 = *(ulong *)(lVar1 + in_RSI * 0xc);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_5d0;
    auVar9._16_8_ = uVar2;
    auVar9._24_8_ = 0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar2;
    auVar8._16_8_ = uVar3;
    auVar8._24_8_ = 0;
    auVar12 = vpunpcklwd_avx2(auVar9,auVar8);
    convolve_4tap(in_stack_fffffffffffff980._16_8_,in_stack_fffffffffffff980._8_8_);
    auVar10._16_8_ = uStack_1d0;
    auVar10._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
    auVar10._24_8_ = uStack_1c8;
    auVar7 = vpaddd_avx2(auVar12,auVar10);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_400;
    auVar7 = vpsrad_avx2(auVar7,auVar6);
    auVar11._16_8_ = uStack_190;
    auVar11._0_16_ = auVar13;
    auVar11._24_8_ = uStack_188;
    auVar7 = vpminsd_avx2(auVar7,auVar11);
    auVar7 = vpmaxsd_avx2(auVar7,ZEXT832(uStack_3d8) << 0x40);
    auVar7 = vpackssdw_avx2(auVar7,auVar7);
    local_6c0 = auVar7._0_8_;
    *(undefined8 *)(in_RDX + (ulong)local_4c4 * in_RCX * 2) = local_6c0;
    uStackY_6a8 = auVar7._24_8_;
    *uStackY_6a8 = local_220;
    in_stack_fffffffffffff980 = auVar12;
    local_5d0 = uVar3;
  }
  return;
}

Assistant:

static void aom_highbd_filter_block1d4_v4_avx2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  const int bits = FILTER_BITS;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const __m256i clip_pixel =
      _mm256_set1_epi32(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();
  uint32_t i;
  __m256i s[2], ff[2];

  pack_filters_4tap(filter, ff);

  const uint16_t *data = src_ptr;
  /* Vertical filter */
  {
    __m128i s2 = _mm_loadl_epi64((__m128i *)(data + 2 * src_pitch));
    __m128i s3 = _mm_loadl_epi64((__m128i *)(data + 3 * src_pitch));

    __m256i s23 = _mm256_inserti128_si256(_mm256_castsi128_si256(s2), s3, 1);

    __m128i s4 = _mm_loadl_epi64((__m128i *)(data + 4 * src_pitch));

    __m256i s34 = _mm256_inserti128_si256(_mm256_castsi128_si256(s3), s4, 1);

    s[0] = _mm256_unpacklo_epi16(s23, s34);

    for (i = 0; i < height; i += 2) {
      data = &src_ptr[i * src_pitch];

      __m128i s5 = _mm_loadl_epi64((__m128i *)(data + 5 * src_pitch));
      __m128i s6 = _mm_loadl_epi64((__m128i *)(data + 6 * src_pitch));

      __m256i s45 = _mm256_inserti128_si256(_mm256_castsi128_si256(s4), s5, 1);
      __m256i s56 = _mm256_inserti128_si256(_mm256_castsi128_si256(s5), s6, 1);

      s[1] = _mm256_unpacklo_epi16(s45, s56);

      const __m256i res_a = convolve_4tap(s, ff);

      __m256i res_a_round = _mm256_sra_epi32(
          _mm256_add_epi32(res_a, round_const_bits), round_shift_bits);

      __m256i res_16bit = _mm256_min_epi32(res_a_round, clip_pixel);
      res_16bit = _mm256_max_epi32(res_16bit, zero);
      res_16bit = _mm256_packs_epi32(res_16bit, res_16bit);

      _mm_storel_epi64((__m128i *)&dst_ptr[i * dst_pitch],
                       _mm256_castsi256_si128(res_16bit));
      _mm_storel_epi64((__m128i *)&dst_ptr[i * dst_pitch + dst_pitch],
                       _mm256_extracti128_si256(res_16bit, 1));

      s[0] = s[1];
      s4 = s6;
    }
  }
}